

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

int jumponcond(FuncState *fs,expdesc *e,int cond)

{
  int iVar1;
  uint uVar2;
  OpCode op;
  
  if ((e->k == VRELOCABLE) && (uVar2 = fs->f->code[(e->u).s.info], (uVar2 & 0x3f) == 0x13)) {
    fs->pc = fs->pc + -1;
    uVar2 = uVar2 >> 0x17;
    cond = (int)(cond == 0);
    op = OP_TEST;
    iVar1 = 0;
  }
  else {
    discharge2anyreg(fs,e);
    freeexp(fs,e);
    iVar1 = (e->u).s.info;
    op = OP_TESTSET;
    uVar2 = 0xff;
  }
  iVar1 = condjump(fs,op,uVar2,iVar1,cond);
  return iVar1;
}

Assistant:

static int jumponcond (FuncState *fs, expdesc *e, int cond) {
  if (e->k == VRELOCABLE) {
    Instruction ie = getcode(fs, e);
    if (GET_OPCODE(ie) == OP_NOT) {
      fs->pc--;  /* remove previous OP_NOT */
      return condjump(fs, OP_TEST, GETARG_B(ie), 0, !cond);
    }
    /* else go through */
  }
  discharge2anyreg(fs, e);
  freeexp(fs, e);
  return condjump(fs, OP_TESTSET, NO_REG, e->u.s.info, cond);
}